

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer.c
# Opt level: O1

void Curl_setup_transfer(Curl_easy *data,int sockindex,curl_off_t size,_Bool getheader,
                        int writesockindex)

{
  int *piVar1;
  ushort uVar2;
  connectdata *pcVar3;
  HTTP *pHVar4;
  char cVar5;
  curl_socket_t cVar6;
  int iVar7;
  curl_socket_t cVar8;
  bool bVar9;
  curltime cVar10;
  
  pcVar3 = data->conn;
  pHVar4 = (data->req).p.http;
  if ((pcVar3->handler->protocol & 3) == 0) {
    bVar9 = false;
  }
  else {
    bVar9 = pHVar4->sending == HTTPSEND_REQUEST;
  }
  if ((((pcVar3->bits).field_0x2 & 0x80) != 0) || (0x13 < pcVar3->httpversion || bVar9)) {
    iVar7 = sockindex;
    if ((sockindex == -1) && (iVar7 = writesockindex, writesockindex == -1)) {
      cVar8 = -1;
    }
    else {
      cVar8 = pcVar3->sock[iVar7];
    }
    pcVar3->sockfd = cVar8;
    pcVar3->writesockfd = cVar8;
    if (bVar9) {
      writesockindex = 0;
    }
  }
  else {
    cVar6 = -1;
    cVar8 = -1;
    if (sockindex != -1) {
      cVar8 = pcVar3->sock[sockindex];
    }
    pcVar3->sockfd = cVar8;
    if (writesockindex != -1) {
      cVar6 = pcVar3->sock[writesockindex];
    }
    pcVar3->writesockfd = cVar6;
  }
  uVar2 = *(ushort *)&(data->req).field_0xbb;
  *(ushort *)&(data->req).field_0xbb = uVar2 & 0xfbff | (ushort)getheader << 10;
  (data->req).size = size;
  if ((!getheader) &&
     (*(ushort *)&(data->req).field_0xbb = uVar2 & 0xfbfe | (ushort)getheader << 10, 0 < size)) {
    Curl_pgrsSetDownloadSize(data,size);
  }
  if ((*(ushort *)&(data->req).field_0xbb & 0x1400) != 0x1000) {
    if (sockindex != -1) {
      piVar1 = &(data->req).keepon;
      *(byte *)piVar1 = (byte)*piVar1 | 1;
    }
    if (writesockindex != -1) {
      cVar5 = (char)*(undefined4 *)&(data->state).field_0x74c;
      if (cVar5 < '\0') {
        if (((pcVar3->handler->protocol & 3) != 0) && (pHVar4->sending == HTTPSEND_BODY)) {
          (data->req).exp100 = EXP100_AWAITING_CONTINUE;
          cVar10 = Curl_now();
          (data->req).start100.tv_sec = cVar10.tv_sec;
          (data->req).start100.tv_usec = cVar10.tv_usec;
          Curl_expire(data,(data->set).expect_100_timeout,EXPIRE_100_TIMEOUT);
          return;
        }
        if (cVar5 < '\0') {
          (data->req).exp100 = EXP100_SENDING_REQUEST;
        }
      }
      piVar1 = &(data->req).keepon;
      *(byte *)piVar1 = (byte)*piVar1 | 2;
    }
  }
  return;
}

Assistant:

void
Curl_setup_transfer(
  struct Curl_easy *data,   /* transfer */
  int sockindex,            /* socket index to read from or -1 */
  curl_off_t size,          /* -1 if unknown at this point */
  bool getheader,           /* TRUE if header parsing is wanted */
  int writesockindex        /* socket index to write to, it may very well be
                               the same we read from. -1 disables */
  )
{
  struct SingleRequest *k = &data->req;
  struct connectdata *conn = data->conn;
  struct HTTP *http = data->req.p.http;
  bool httpsending;

  DEBUGASSERT(conn != NULL);
  DEBUGASSERT((sockindex <= 1) && (sockindex >= -1));

  httpsending = ((conn->handler->protocol&PROTO_FAMILY_HTTP) &&
                 (http->sending == HTTPSEND_REQUEST));

  if(conn->bits.multiplex || conn->httpversion >= 20 || httpsending) {
    /* when multiplexing, the read/write sockets need to be the same! */
    conn->sockfd = sockindex == -1 ?
      ((writesockindex == -1 ? CURL_SOCKET_BAD : conn->sock[writesockindex])) :
      conn->sock[sockindex];
    conn->writesockfd = conn->sockfd;
    if(httpsending)
      /* special and very HTTP-specific */
      writesockindex = FIRSTSOCKET;
  }
  else {
    conn->sockfd = sockindex == -1 ?
      CURL_SOCKET_BAD : conn->sock[sockindex];
    conn->writesockfd = writesockindex == -1 ?
      CURL_SOCKET_BAD:conn->sock[writesockindex];
  }
  k->getheader = getheader;

  k->size = size;

  /* The code sequence below is placed in this function just because all
     necessary input is not always known in do_complete() as this function may
     be called after that */

  if(!k->getheader) {
    k->header = FALSE;
    if(size > 0)
      Curl_pgrsSetDownloadSize(data, size);
  }
  /* we want header and/or body, if neither then don't do this! */
  if(k->getheader || !data->req.no_body) {

    if(sockindex != -1)
      k->keepon |= KEEP_RECV;

    if(writesockindex != -1) {
      /* HTTP 1.1 magic:

         Even if we require a 100-return code before uploading data, we might
         need to write data before that since the REQUEST may not have been
         finished sent off just yet.

         Thus, we must check if the request has been sent before we set the
         state info where we wait for the 100-return code
      */
      if((data->state.expect100header) &&
         (conn->handler->protocol&PROTO_FAMILY_HTTP) &&
         (http->sending == HTTPSEND_BODY)) {
        /* wait with write until we either got 100-continue or a timeout */
        k->exp100 = EXP100_AWAITING_CONTINUE;
        k->start100 = Curl_now();

        /* Set a timeout for the multi interface. Add the inaccuracy margin so
           that we don't fire slightly too early and get denied to run. */
        Curl_expire(data, data->set.expect_100_timeout, EXPIRE_100_TIMEOUT);
      }
      else {
        if(data->state.expect100header)
          /* when we've sent off the rest of the headers, we must await a
             100-continue but first finish sending the request */
          k->exp100 = EXP100_SENDING_REQUEST;

        /* enable the write bit when we're not waiting for continue */
        k->keepon |= KEEP_SEND;
      }
    } /* if(writesockindex != -1) */
  } /* if(k->getheader || !data->req.no_body) */

}